

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O0

void enlist_str(CVmObjList *lst,int idx,date_parse_string *str)

{
  size_t in_RDI;
  
  enlist_str(lst,idx,(char *)str,in_RDI);
  return;
}

Assistant:

static void enlist_str(VMG_ CVmObjList *lst, int idx,
                       const date_parse_string &str)
{
    enlist_str(vmg_ lst, idx, str.p, str.len);
}